

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

bool __thiscall cmNinjaTargetGenerator::NeedDepTypeMSVC(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  cmGlobalNinjaGenerator *this_01;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+(&bStack_38,"CMAKE_NINJA_DEPTYPE_",lang);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  bVar1 = std::operator==(psVar2,"msvc");
  if (bVar1) {
    return true;
  }
  bVar1 = std::operator==(psVar2,"intel");
  if (bVar1) {
    this_01 = GetGlobalGenerator(this);
    bVar1 = cmGlobalNinjaGenerator::SupportsMultilineDepfile(this_01);
    if (!bVar1) {
      return true;
    }
    psVar2 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile)
    ;
    lVar3 = std::__cxx11::string::find((char)psVar2,0x20);
    if (lVar3 != -1) {
      return true;
    }
    psVar2 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    lVar3 = std::__cxx11::string::find((char)psVar2,0x20);
    if (lVar3 != -1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cmNinjaTargetGenerator::NeedDepTypeMSVC(const std::string& lang) const
{
  std::string const& deptype =
    this->GetMakefile()->GetSafeDefinition("CMAKE_NINJA_DEPTYPE_" + lang);
  if (deptype == "msvc") {
    return true;
  }
  if (deptype == "intel") {
    // Ninja does not really define "intel", but we use it to switch based
    // on whether this environment supports "gcc" or "msvc" deptype.
    if (!this->GetGlobalGenerator()->SupportsMultilineDepfile()) {
      // This ninja version is too old to support the Intel depfile format.
      // Fall back to msvc deptype.
      return true;
    }
    if ((this->Makefile->GetHomeDirectory().find(' ') != std::string::npos) ||
        (this->Makefile->GetHomeOutputDirectory().find(' ') !=
         std::string::npos)) {
      // The Intel compiler does not properly escape spaces in a depfile.
      // Fall back to msvc deptype.
      return true;
    }
  }
  return false;
}